

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O0

PianoWidget * __thiscall PianoWidget::getPixmap(PianoWidget *this,Pixmaps id)

{
  byte bVar1;
  const_reference ppcVar2;
  uint in_EDX;
  QFlags<Qt::ImageConversionFlag> local_48 [4];
  undefined1 local_38 [8];
  QString key;
  Pixmaps id_local;
  PianoWidget *this_local;
  QPixmap *pixmap;
  
  key.d.size._3_1_ = 0;
  key.d.size._4_4_ = in_EDX;
  QPixmap::QPixmap((QPixmap *)this);
  ppcVar2 = std::array<const_char_*,_4UL>::operator[]
                      ((array<const_char_*,_4UL> *)PianoWidgetTU::PIXMAP_PATHS,
                       (ulong)key.d.size._4_4_);
  QString::QString((QString *)local_38,*ppcVar2);
  bVar1 = QPixmapCache::find((QString *)local_38,(QPixmap *)this);
  if ((bVar1 & 1) == 0) {
    QFlags<Qt::ImageConversionFlag>::QFlags(local_48,AutoColor);
    QPixmap::load((QString *)this,local_38,(QFlags_conflict1 *)0x0);
    QPixmapCache::insert((QString *)local_38,(QPixmap *)this);
  }
  key.d.size._3_1_ = 1;
  QString::~QString((QString *)local_38);
  if ((key.d.size._3_1_ & 1) == 0) {
    QPixmap::~QPixmap((QPixmap *)this);
  }
  return this;
}

Assistant:

QPixmap PianoWidget::getPixmap(Pixmaps id) {
    QPixmap pixmap;
    QString const key = TU::PIXMAP_PATHS[id];
    if (!QPixmapCache::find(key, &pixmap)) {
        pixmap.load(key);
        QPixmapCache::insert(key, pixmap);
    }
    return pixmap;
}